

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
::HandleLinkingPrograms
          (PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
           *this,bool WaitForCompletion)

{
  PipelineStateGLImpl *this_00;
  undefined *puVar1;
  bool bVar2;
  SHADER_TYPE SVar3;
  LinkStatus LVar4;
  PSO_CREATE_INTERNAL_FLAGS InternalFlags;
  Char *pCVar5;
  TShaderStages *this_01;
  reference ppSVar6;
  size_type sVar7;
  RenderDeviceGLImpl *pRVar8;
  GLProgramCache *pGVar9;
  reference ppSVar10;
  ShaderDesc *pSVar11;
  element_type *peVar12;
  ostream *poVar13;
  string *psVar14;
  undefined8 uVar15;
  char (*in_RCX) [34];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  char (*in_R8) [19];
  PipelineResourceLayoutDesc *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  Diligent local_2d0 [32];
  undefined1 local_2b0 [8];
  string _msg;
  ostringstream ss;
  uint local_114;
  LinkStatus LinkStatus;
  Uint32 i_1;
  undefined8 local_100;
  GetProgramAttribs ProgAttribs_1;
  GetProgramAttribs ProgAttribs;
  size_t i;
  undefined1 local_90 [8];
  string msg_1;
  SHADER_TYPE ShaderType;
  ShaderGLImpl *pShaderGL;
  iterator __end0;
  iterator __begin0;
  TShaderStages *__range2;
  SHADER_TYPE ActiveStages;
  undefined1 local_38 [8];
  string msg;
  bool WaitForCompletion_local;
  PipelineBuilder<Diligent::ComputePipelineStateCreateInfo,_Diligent::ComputePipelineStateCreateInfoX>
  *this_local;
  
  msg.field_2._M_local_buf[0xf] = WaitForCompletion;
  if ((this->super_PipelineBuilderBase).m_State != LinkingPrograms) {
    FormatString<char[26],char[34]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::LinkingPrograms",in_RCX);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"HandleLinkingPrograms",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x177);
    std::__cxx11::string::~string((string *)local_38);
  }
  __range2._0_4_ = SHADER_TYPE_UNKNOWN;
  this_01 = &(this->super_PipelineBuilderBase).m_Shaders;
  __end0 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::begin
                     (this_01);
  pShaderGL = (ShaderGLImpl *)
              std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::end
                        (this_01);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<Diligent::ShaderGLImpl_**,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
                                     *)&pShaderGL), bVar2) {
    ppSVar6 = __gnu_cxx::
              __normal_iterator<Diligent::ShaderGLImpl_**,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
              ::operator*(&__end0);
    pSVar11 = DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
              ::GetDesc((DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                         *)*ppSVar6);
    msg_1.field_2._12_4_ = pSVar11->ShaderType;
    SVar3 = Diligent::operator&((SHADER_TYPE)__range2,msg_1.field_2._12_4_);
    if (SVar3 != SHADER_TYPE_UNKNOWN) {
      i = (size_t)GetShaderTypeLiteralName(msg_1.field_2._12_4_);
      FormatString<char[14],char_const*,char[19]>
                ((string *)local_90,(Diligent *)"Shader stage ",(char (*) [14])&i,
                 (char **)" is already active",in_R8);
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"HandleLinkingPrograms",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0x17e);
      std::__cxx11::string::~string((string *)local_90);
    }
    Diligent::operator|=((SHADER_TYPE *)&__range2,msg_1.field_2._12_4_);
    __gnu_cxx::
    __normal_iterator<Diligent::ShaderGLImpl_**,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::operator++(&__end0);
  }
  if ((((this->super_PipelineBuilderBase).m_Pipeline)->m_IsProgramPipelineSupported & 1U) == 0) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms)
    ;
    if (!bVar2) {
      local_100 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::
                  data(&(this->super_PipelineBuilderBase).m_Shaders);
      sVar7 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::size
                        (&(this->super_PipelineBuilderBase).m_Shaders);
      ProgAttribs_1.ppShaders._0_4_ = (undefined4)sVar7;
      ProgAttribs_1.ppShaders._4_1_ = 0;
      if ((this->m_CreateInfo).
          super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
          .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.
          ResourceSignaturesCount == 0) {
        local_330 = &(this->m_CreateInfo).
                     super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
                     .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.PSODesc.
                     ResourceLayout;
      }
      else {
        local_330 = (PipelineResourceLayoutDesc *)0x0;
      }
      ProgAttribs_1._8_8_ = local_330;
      ProgAttribs_1.pResourceLayout =
           (PipelineResourceLayoutDesc *)
           (this->m_CreateInfo).
           super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
           .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.ppResourceSignatures;
      ProgAttribs_1.ppSignatures._0_4_ =
           (this->m_CreateInfo).
           super_PipelineStateCreateInfoX<Diligent::ComputePipelineStateCreateInfoX,_Diligent::ComputePipelineStateCreateInfo>
           .super_ComputePipelineStateCreateInfo.super_PipelineStateCreateInfo.
           ResourceSignaturesCount;
      pRVar8 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
               ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                            *)(this->super_PipelineBuilderBase).m_Pipeline);
      pGVar9 = RenderDeviceGLImpl::GetProgramCache(pRVar8);
      GLProgramCache::GetProgram((GLProgramCache *)&LinkStatus,(GetProgramAttribs *)pGVar9);
      std::shared_ptr<Diligent::GLProgram>::operator=
                (((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms,
                 (shared_ptr<Diligent::GLProgram> *)&LinkStatus);
      std::shared_ptr<Diligent::GLProgram>::~shared_ptr
                ((shared_ptr<Diligent::GLProgram> *)&LinkStatus);
      *((this->super_PipelineBuilderBase).m_Pipeline)->m_ShaderTypes = (SHADER_TYPE)__range2;
    }
  }
  else {
    ProgAttribs.NumSignatures = 0;
    ProgAttribs._36_4_ = 0;
    for (; sVar7 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                   ::size(&(this->super_PipelineBuilderBase).m_Shaders),
        (ulong)ProgAttribs._32_8_ < sVar7; ProgAttribs._32_8_ = ProgAttribs._32_8_ + 1) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         (((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms +
                         ProgAttribs._32_8_));
      if (!bVar2) {
        std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::operator[]
                  (&(this->super_PipelineBuilderBase).m_Shaders,ProgAttribs._32_8_);
        pRVar8 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                 ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                              *)(this->super_PipelineBuilderBase).m_Pipeline);
        pGVar9 = RenderDeviceGLImpl::GetProgramCache(pRVar8);
        GLProgramCache::GetProgram
                  ((GLProgramCache *)&ProgAttribs_1.NumSignatures,(GetProgramAttribs *)pGVar9);
        std::shared_ptr<Diligent::GLProgram>::operator=
                  (((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms + ProgAttribs._32_8_
                   ,(shared_ptr<Diligent::GLProgram> *)&ProgAttribs_1.NumSignatures);
        std::shared_ptr<Diligent::GLProgram>::~shared_ptr
                  ((shared_ptr<Diligent::GLProgram> *)&ProgAttribs_1.NumSignatures);
        ppSVar10 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                   ::operator[](&(this->super_PipelineBuilderBase).m_Shaders,ProgAttribs._32_8_);
        pSVar11 = DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                  ::GetDesc((DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                             *)*ppSVar10);
        ((this->super_PipelineBuilderBase).m_Pipeline)->m_ShaderTypes[ProgAttribs._32_8_] =
             pSVar11->ShaderType;
      }
    }
  }
  local_114 = 0;
  while( true ) {
    if (((this->super_PipelineBuilderBase).m_Pipeline)->m_NumPrograms <= local_114) {
      this_00 = (this->super_PipelineBuilderBase).m_Pipeline;
      InternalFlags =
           PipelineStateBase<Diligent::EngineGLImplTraits>::GetInternalCreateFlags
                     ((PipelineStateCreateInfo *)&this->m_CreateInfo);
      InitResourceLayout(this_00,InternalFlags,&(this->super_PipelineBuilderBase).m_Shaders,
                         (SHADER_TYPE)__range2);
      (this->super_PipelineBuilderBase).m_State = Complete;
      return;
    }
    peVar12 = std::
              __shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)(((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms +
                            local_114));
    LVar4 = GLProgram::GetLinkStatus(peVar12,(bool)(msg.field_2._M_local_buf[0xf] & 1));
    if (LVar4 == InProgress) break;
    if (LVar4 == Failed) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(_msg.field_2._M_local_buf + 8));
      poVar13 = std::operator<<((ostream *)(_msg.field_2._M_local_buf + 8),"Failed to link program "
                               );
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,local_114);
      poVar13 = std::operator<<(poVar13," for pipeline state \'");
      poVar13 = std::operator<<(poVar13,(((this->super_PipelineBuilderBase).m_Pipeline)->
                                        super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                                        super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                                        .m_Desc.super_DeviceObjectAttribs.Name);
      poVar13 = std::operator<<(poVar13,"\': ");
      peVar12 = std::
                __shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)(((this->super_PipelineBuilderBase).m_Pipeline)->m_GLPrograms +
                              local_114));
      psVar14 = GLProgram::GetInfoLog_abi_cxx11_(peVar12);
      std::operator<<(poVar13,(string *)psVar14);
      if (((this->super_PipelineBuilderBase).m_CreateAsynchronously & 1U) == 0) {
        std::__cxx11::ostringstream::str();
        LogError<true,std::__cxx11::string>
                  (false,"HandleLinkingPrograms",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x1bb,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
      }
      else {
        std::__cxx11::ostringstream::str();
        FormatString<std::__cxx11::string>((string *)local_2b0,local_2d0,Args);
        std::__cxx11::string::~string((string *)local_2d0);
        puVar1 = DebugMessageCallback;
        if (DebugMessageCallback != (undefined *)0x0) {
          uVar15 = std::__cxx11::string::c_str();
          (*(code *)puVar1)(2,uVar15,0);
        }
        std::__cxx11::string::~string((string *)local_2b0);
      }
      (this->super_PipelineBuilderBase).m_State = Failed;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(_msg.field_2._M_local_buf + 8));
      return;
    }
    local_114 = local_114 + 1;
  }
  return;
}

Assistant:

void HandleLinkingPrograms(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::LinkingPrograms);

        // Get active shader stages
        SHADER_TYPE ActiveStages = SHADER_TYPE_UNKNOWN;
        for (const ShaderGLImpl* pShaderGL : m_Shaders)
        {
            const auto ShaderType = pShaderGL->GetDesc().ShaderType;
            VERIFY((ActiveStages & ShaderType) == 0, "Shader stage ", GetShaderTypeLiteralName(ShaderType), " is already active");
            ActiveStages |= ShaderType;
        }

        // Create programs

        // Linking programs may be epxensive, so we cache programs keyed by shader IDs and resource signature IDs or resource layout.
        if (m_Pipeline.m_IsProgramPipelineSupported)
        {
            for (size_t i = 0; i < m_Shaders.size(); ++i)
            {
                if (!m_Pipeline.m_GLPrograms[i])
                {
                    GLProgramCache::GetProgramAttribs ProgAttribs{
                        &m_Shaders[i],
                        1,
                        true, // IsSeparableProgram
                        m_CreateInfo.ResourceSignaturesCount == 0 ? &m_CreateInfo.PSODesc.ResourceLayout : nullptr,
                        m_CreateInfo.ppResourceSignatures,
                        m_CreateInfo.ResourceSignaturesCount,
                    };
                    m_Pipeline.m_GLPrograms[i]  = m_Pipeline.GetDevice()->GetProgramCache().GetProgram(ProgAttribs);
                    m_Pipeline.m_ShaderTypes[i] = m_Shaders[i]->GetDesc().ShaderType;
                }
            }
        }
        else
        {
            if (!m_Pipeline.m_GLPrograms[0])
            {
                GLProgramCache::GetProgramAttribs ProgAttribs{
                    m_Shaders.data(),
                    static_cast<Uint32>(m_Shaders.size()),
                    false, // IsSeparableProgram
                    m_CreateInfo.ResourceSignaturesCount == 0 ? &m_CreateInfo.PSODesc.ResourceLayout : nullptr,
                    m_CreateInfo.ppResourceSignatures,
                    m_CreateInfo.ResourceSignaturesCount,
                };
                m_Pipeline.m_GLPrograms[0]  = m_Pipeline.GetDevice()->GetProgramCache().GetProgram(ProgAttribs);
                m_Pipeline.m_ShaderTypes[0] = ActiveStages;
            }
        }

        // Check program linking status
        for (Uint32 i = 0; i < m_Pipeline.m_NumPrograms; ++i)
        {
            GLProgram::LinkStatus LinkStatus = m_Pipeline.m_GLPrograms[i]->GetLinkStatus(WaitForCompletion);
            if (LinkStatus == GLProgram::LinkStatus::InProgress)
            {
                return;
            }
            else if (LinkStatus == GLProgram::LinkStatus::Failed)
            {
                std::ostringstream ss;
                ss << "Failed to link program " << i << " for pipeline state '" << m_Pipeline.m_Desc.Name << "': " << m_Pipeline.m_GLPrograms[i]->GetInfoLog();
                if (m_CreateAsynchronously)
                {
                    LOG_ERROR_MESSAGE(ss.str());
                }
                else
                {
                    LOG_ERROR_AND_THROW(ss.str());
                }
                m_State = State::Failed;
                return;
            }
        }

        m_Pipeline.InitResourceLayout(GetInternalCreateFlags(m_CreateInfo), m_Shaders, ActiveStages);
        m_State = State::Complete;
    }